

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_spy_ModuleEnumerator.cpp
# Opt level: O1

StringRef * __thiscall axl::spy::ModuleIterator::prepareModuleFileName(ModuleIterator *this)

{
  StringRefBase<char,_axl::sl::StringDetailsBase<char>_> local_30;
  
  if (this->m_linkMap != (link_map *)0x0) {
    sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::StringRefBase
              (&local_30,this->m_linkMap->l_name);
    sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::move
              (&this->m_moduleFileName,&local_30);
    sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::release(&local_30);
    if ((this->m_moduleFileName).m_length == 0) {
      io::getExeFilePath();
      sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::move
                (&this->m_moduleFileName,&local_30);
      sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::release(&local_30);
    }
  }
  return &this->m_moduleFileName;
}

Assistant:

const sl::StringRef&
ModuleIterator::prepareModuleFileName() const {
	if (!m_linkMap)
		return m_moduleFileName;

	m_moduleFileName = m_linkMap->l_name;

	if (m_moduleFileName.isEmpty())
		m_moduleFileName = io::getExeFilePath();

	return m_moduleFileName;
}